

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

bool Json::converToUInt(char *str,unsigned_long *_ret)

{
  int *piVar1;
  ulong uVar2;
  bool bVar3;
  char *endptr;
  char *local_30;
  
  local_30 = (char *)0x0;
  piVar1 = __errno_location();
  *piVar1 = 0;
  bVar3 = false;
  uVar2 = strtoul(str,&local_30,0);
  if ((((*piVar1 != 0x22 || uVar2 != 0xffffffffffffffff) &&
       (bVar3 = false, *piVar1 == 0 || uVar2 != 0)) && (local_30 != str)) &&
     (bVar3 = true, _ret != (unsigned_long *)0x0)) {
    *_ret = uVar2;
  }
  return bVar3;
}

Assistant:

static bool
converToUInt (const char *str, unsigned long int *_ret)
{
  unsigned long int val;
  char *endptr = NULL;

  errno = 0; /* To distinguish success/failure after call */
  val = strtoul(str, &endptr, 0);

  if ((errno == ERANGE && val == ULONG_MAX) || (errno != 0 && val == 0)) {
    return false;
  }

  if (str == endptr) {
    /* Nothing parsed from the string */
    return false;
  }

  if (_ret != NULL) {
    *_ret = val;
  }

  return true;
}